

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r,secp256k1_scalar *a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  secp256k1_modinv64_modinfo *psVar5;
  ulong uVar6;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  secp256k1_modinv64_modinfo *b;
  ulong uVar14;
  secp256k1_modinv64_signed62 *psVar15;
  uint uVar16;
  ulong uVar17;
  ulong *extraout_RDX;
  int64_t *piVar18;
  long lVar19;
  long lVar20;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_09;
  long lVar21;
  long lVar22;
  secp256k1_modinv64_signed62 *b_00;
  undefined8 unaff_RBX;
  int64_t *piVar23;
  int64_t *unaff_RBP;
  int64_t *piVar24;
  ulong uVar25;
  long lVar26;
  int64_t *a_01;
  secp256k1_modinv64_modinfo *psVar27;
  int64_t *piVar28;
  secp256k1_modinv64_signed62 *psVar29;
  secp256k1_modinv64_signed62 *psVar30;
  int64_t *piVar31;
  undefined1 *puVar32;
  int64_t *piVar33;
  int64_t *piVar34;
  secp256k1_modinv64_signed62 *psVar35;
  int64_t *piVar36;
  long lVar37;
  secp256k1_modinv64_modinfo *unaff_R12;
  secp256k1_modinv64_modinfo *psVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  secp256k1_modinv64_modinfo *psVar42;
  bool bVar43;
  bool bVar44;
  secp256k1_modinv64_signed62 sStack_248;
  secp256k1_modinv64_signed62 sStack_220;
  int64_t *piStack_1f8;
  int64_t *piStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  ulong uStack_1e0;
  int64_t *piStack_1d8;
  ulong uStack_1d0;
  int64_t *piStack_1c8;
  secp256k1_modinv64_modinfo *psStack_1c0;
  int64_t *piStack_1b8;
  long lStack_1b0;
  long lStack_1a8;
  int64_t *piStack_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  long lStack_180;
  long lStack_178;
  int64_t *piStack_170;
  int64_t *piStack_168;
  secp256k1_modinv64_modinfo *psStack_160;
  int64_t *piStack_158;
  int64_t *piStack_150;
  long lStack_148;
  int64_t *piStack_140;
  int64_t *piStack_138;
  undefined8 uStack_130;
  ulong uStack_128;
  secp256k1_modinv64_signed62 sStack_120;
  int64_t *piStack_f0;
  secp256k1_modinv64_modinfo *psStack_e8;
  int64_t *piStack_e0;
  ulong auStack_d8 [5];
  secp256k1_modinv64_trans2x2 sStack_b0;
  secp256k1_modinv64_signed62 sStack_90;
  secp256k1_modinv64_signed62 sStack_60;
  int64_t *piStack_38;
  
  uVar14 = a->d[1];
  uVar25 = a->d[2];
  uVar9 = a->d[3];
  bVar44 = uVar9 != 0xffffffffffffffff;
  bVar43 = 0xbaaedce6af48a03a < uVar14;
  piVar23 = (int64_t *)CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar43);
  psVar42 = (secp256k1_modinv64_modinfo *)a->d[0];
  if ((psVar42 < (secp256k1_modinv64_modinfo *)0xbfd25e8cd0364141 ||
      ((uVar25 < 0xfffffffffffffffe || bVar44) || !bVar43)) &&
      ((uVar14 < 0xbaaedce6af48a03c || ((uVar25 < 0xfffffffffffffffe || bVar44) || !bVar43)) &&
      (uVar25 != 0xffffffffffffffff || bVar44))) {
    r->v[0] = (ulong)psVar42 & 0x3fffffffffffffff;
    r->v[1] = (uVar14 & 0xfffffffffffffff) << 2 | (ulong)psVar42 >> 0x3e;
    r->v[2] = (uVar25 & 0x3ffffffffffffff) << 4 | uVar14 >> 0x3c;
    r->v[3] = (uVar9 & 0xffffffffffffff) << 6 | uVar25 >> 0x3a;
    r->v[4] = uVar9 >> 0x38;
    return;
  }
  secp256k1_scalar_to_signed62_cold_1();
  sStack_90.v[2] = 0;
  sStack_90.v[3] = 0;
  sStack_90.v[0] = 0;
  sStack_90.v[1] = 0;
  sStack_90.v[4] = 0;
  sStack_60.v[3] = 0;
  sStack_60.v[4] = 0;
  sStack_60.v[1] = 0;
  sStack_60.v[2] = 0;
  sStack_60.v[0] = 1;
  sStack_120.v[4] = (psVar42->modulus).v[4];
  sStack_120.v[0] = (psVar42->modulus).v[0];
  sStack_120.v[1] = (psVar42->modulus).v[1];
  sStack_120.v[2] = (psVar42->modulus).v[2];
  sStack_120.v[3] = (psVar42->modulus).v[3];
  auStack_d8[3] = *(undefined8 *)((long)r + 0x20);
  piStack_e0 = *(int64_t **)r;
  auStack_d8[0] = *(ulong *)((long)r + 8);
  auStack_d8[1] = *(undefined8 *)((long)r + 0x10);
  auStack_d8[2] = *(undefined8 *)((long)r + 0x18);
  uStack_128 = 0;
  lVar41 = -1;
  uStack_130._4_4_ = 5;
  piStack_f0 = r->v;
  psStack_e8 = psVar42;
  piStack_38 = piVar23;
LAB_001453da:
  psVar42 = psStack_e8;
  piVar18 = (int64_t *)sStack_120.v[0];
  psVar5 = (secp256k1_modinv64_modinfo *)0x0;
  piVar31 = (int64_t *)0x0;
  psVar27 = (secp256k1_modinv64_modinfo *)0x1;
  uVar16 = 0x3e;
  piVar24 = (int64_t *)0x1;
  piVar34 = piStack_e0;
  piVar28 = (int64_t *)sStack_120.v[0];
  while( true ) {
    a_01 = (int64_t *)(-1L << ((byte)uVar16 & 0x3f) | (ulong)piVar34);
    b = (secp256k1_modinv64_modinfo *)0x0;
    if (a_01 != (int64_t *)0x0) {
      for (; ((ulong)a_01 >> (long)b & 1) == 0;
          b = (secp256k1_modinv64_modinfo *)((long)(b->modulus).v + 1)) {
      }
    }
    bVar11 = (byte)b;
    piVar33 = (int64_t *)((ulong)piVar34 >> (bVar11 & 0x3f));
    piVar24 = (int64_t *)((long)piVar24 << (bVar11 & 0x3f));
    psVar5 = (secp256k1_modinv64_modinfo *)((long)psVar5 << (bVar11 & 0x3f));
    lVar41 = lVar41 - (long)b;
    uVar16 = uVar16 - (int)b;
    if (uVar16 == 0) break;
    if (((ulong)piVar28 & 1) == 0) {
      piStack_138 = (int64_t *)0x145874;
      secp256k1_modinv64_var_cold_8();
LAB_00145874:
      piStack_138 = (int64_t *)0x145879;
      secp256k1_modinv64_var_cold_7();
LAB_00145879:
      piStack_138 = (int64_t *)0x14587e;
      secp256k1_modinv64_var_cold_1();
LAB_0014587e:
      piStack_138 = (int64_t *)0x145883;
      secp256k1_modinv64_var_cold_2();
LAB_00145883:
      piStack_138 = (int64_t *)0x145888;
      secp256k1_modinv64_var_cold_6();
      piVar33 = piVar28;
      goto LAB_00145888;
    }
    if (((ulong)piVar33 & 1) == 0) goto LAB_00145874;
    a_01 = (int64_t *)((long)psVar5 * (long)piStack_e0 + (long)piVar24 * sStack_120.v[0]);
    b = (secp256k1_modinv64_modinfo *)(ulong)(0x3e - uVar16);
    bVar11 = (byte)(0x3e - uVar16);
    piVar23 = (int64_t *)((long)piVar28 << (bVar11 & 0x3f));
    if (a_01 != piVar23) goto LAB_00145879;
    piVar23 = (int64_t *)((long)psVar27 * (long)piStack_e0 + (long)piVar31 * sStack_120.v[0]);
    a_01 = (int64_t *)((long)piVar33 << (bVar11 & 0x3f));
    if (piVar23 != a_01) goto LAB_0014587e;
    b = (secp256k1_modinv64_modinfo *)(lVar41 - 0x2ea);
    if (b < (secp256k1_modinv64_modinfo *)0xfffffffffffffa2d) goto LAB_00145883;
    iVar4 = (int)piVar33;
    if (lVar41 < 0) {
      lVar41 = -lVar41;
      uVar12 = (int)lVar41 + 1;
      if ((int)uVar16 <= (int)uVar12) {
        uVar12 = uVar16;
      }
      b = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
      a_01 = (int64_t *)(ulong)(uVar12 - 0x3f);
      if (0xffffffc1 < uVar12 - 0x3f) {
        psVar38 = (secp256k1_modinv64_modinfo *)-(long)psVar5;
        unaff_RBP = (int64_t *)-(long)piVar24;
        piVar34 = (int64_t *)-(long)piVar28;
        piVar23 = (int64_t *)((ulong)(0x3fL << (-(char)uVar12 & 0x3fU)) >> (-(char)uVar12 & 0x3fU));
        uVar12 = (iVar4 * iVar4 + 0x3e) * iVar4 * (int)piVar34 & (uint)piVar23;
        psVar5 = psVar27;
        piVar24 = piVar31;
        unaff_R12 = psVar38;
        goto LAB_00145536;
      }
      goto LAB_00145892;
    }
    uVar12 = (int)lVar41 + 1;
    if ((int)uVar16 <= (int)uVar12) {
      uVar12 = uVar16;
    }
    b = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
    a_01 = (int64_t *)(ulong)(uVar12 - 0x3f);
    if (uVar12 - 0x3f < 0xffffffc2) goto LAB_0014588d;
    piVar23 = (int64_t *)((ulong)(0xfL << (-(char)uVar12 & 0x3fU)) >> (-(char)uVar12 & 0x3fU));
    uVar12 = -(iVar4 * (((int)piVar28 * 2 + 2U & 8) + (int)piVar28)) & (uint)piVar23;
    unaff_RBP = piVar31;
    psVar38 = psVar27;
    piVar34 = piVar33;
    piVar33 = piVar28;
LAB_00145536:
    uVar14 = (ulong)uVar12;
    a_01 = (int64_t *)(uVar14 * (long)piVar33);
    piVar34 = (int64_t *)((long)piVar34 + (long)a_01);
    piVar31 = (int64_t *)((long)piVar24 * uVar14 + (long)unaff_RBP);
    b = (secp256k1_modinv64_modinfo *)(uVar14 * (long)psVar5);
    psVar27 = (secp256k1_modinv64_modinfo *)((long)(psVar38->modulus).v + (long)(b->modulus).v);
    piVar28 = piVar33;
    if (((ulong)piVar34 & (ulong)piVar23) != 0) {
LAB_00145888:
      piStack_138 = (int64_t *)0x14588d;
      secp256k1_modinv64_var_cold_4();
      piVar28 = piVar33;
LAB_0014588d:
      piStack_138 = (int64_t *)0x145892;
      secp256k1_modinv64_var_cold_3();
LAB_00145892:
      piStack_138 = (int64_t *)0x145897;
      secp256k1_modinv64_var_cold_5();
      psVar42 = unaff_R12;
      goto LAB_00145897;
    }
  }
  a_01 = (int64_t *)((long)psVar5 * (long)piVar31);
  b = SUB168(SEXT816((long)psVar5) * SEXT816((long)piVar31),8);
  sStack_b0.u = (int64_t)piVar24;
  sStack_b0.v = (int64_t)psVar5;
  sStack_b0.q = (int64_t)piVar31;
  sStack_b0.r = (int64_t)psVar27;
  if ((long)piVar24 * (long)psVar27 - (long)a_01 != 0x4000000000000000 ||
      SUB168(SEXT816((long)piVar24) * SEXT816((long)psVar27),8) - (long)b !=
      (ulong)((secp256k1_modinv64_signed62 *)((long)piVar24 * (long)psVar27) < a_01))
  goto LAB_001458ce;
  piStack_138 = (int64_t *)0x1455c4;
  secp256k1_modinv64_update_de_62(&sStack_90,&sStack_60,&sStack_b0,psStack_e8);
  uVar16 = uStack_130._4_4_;
  piVar18 = sStack_120.v;
  piVar23 = (int64_t *)(ulong)uStack_130._4_4_;
  piVar24 = (int64_t *)(ulong)uStack_130._4_4_;
  b = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
  piStack_138 = (int64_t *)0x1455e1;
  a_01 = piVar18;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)piVar18,uStack_130._4_4_,&psVar42->modulus,-1);
  piVar28 = (int64_t *)&piStack_e0;
  if (0 < iVar4) {
    b = (secp256k1_modinv64_modinfo *)0x1;
    piVar24 = (int64_t *)(ulong)uVar16;
    piStack_138 = (int64_t *)0x145600;
    a_01 = piVar18;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar18,uVar16,&psVar42->modulus,1);
    if (0 < iVar4) goto LAB_0014589c;
    piVar24 = (int64_t *)(ulong)uVar16;
    b = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    piStack_138 = (int64_t *)0x14561c;
    a_01 = piVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar28,uVar16,&psVar42->modulus,-1);
    if (iVar4 < 1) goto LAB_001458a1;
    b = (secp256k1_modinv64_modinfo *)0x1;
    piVar24 = (int64_t *)(ulong)uVar16;
    piStack_138 = (int64_t *)0x145636;
    a_01 = piVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar28,uVar16,&psVar42->modulus,1);
    if (-1 < iVar4) goto LAB_001458a6;
    piStack_138 = (int64_t *)0x145653;
    secp256k1_modinv64_update_fg_62_var
              (uVar16,(secp256k1_modinv64_signed62 *)piVar18,(secp256k1_modinv64_signed62 *)piVar28,
               &sStack_b0);
    if (piStack_e0 == (int64_t *)0x0) {
      if (1 < (int)uVar16) {
        uVar14 = 1;
        uVar25 = 0;
        do {
          uVar25 = uVar25 | auStack_d8[uVar14 - 1];
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
        if (uVar25 != 0) goto LAB_00145683;
      }
      a_01 = (int64_t *)&piStack_e0;
      piVar24 = (int64_t *)(ulong)uVar16;
      b = (secp256k1_modinv64_modinfo *)0x0;
      piStack_138 = (int64_t *)0x145768;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,uVar16,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 != 0) goto LAB_001458c4;
      piStack_138 = (int64_t *)0x14578a;
      iVar4 = secp256k1_modinv64_mul_cmp_62(&sStack_120,uVar16,&SECP256K1_SIGNED62_ONE,-1);
      piVar18 = piStack_f0;
      if (iVar4 != 0) {
        piStack_138 = (int64_t *)0x1457af;
        iVar4 = secp256k1_modinv64_mul_cmp_62(&sStack_120,uVar16,&SECP256K1_SIGNED62_ONE,1);
        if (iVar4 != 0) {
          piVar24 = (int64_t *)0x5;
          b = (secp256k1_modinv64_modinfo *)0x0;
          piStack_138 = (int64_t *)0x1457c9;
          a_01 = piVar18;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)piVar18,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_001458c9;
          a_01 = sStack_90.v;
          piVar24 = (int64_t *)0x5;
          b = (secp256k1_modinv64_modinfo *)0x0;
          piStack_138 = (int64_t *)0x1457ec;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_001458c9;
          piStack_138 = (int64_t *)0x145808;
          iVar4 = secp256k1_modinv64_mul_cmp_62(&sStack_120,uVar16,&psVar42->modulus,1);
          if (iVar4 != 0) {
            a_01 = sStack_120.v;
            piVar24 = (int64_t *)(ulong)uVar16;
            b = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
            piStack_138 = (int64_t *)0x145822;
            iVar4 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)a_01,uVar16,&psVar42->modulus,-1);
            if (iVar4 != 0) goto LAB_001458c9;
          }
        }
      }
      piStack_138 = (int64_t *)0x145845;
      secp256k1_modinv64_normalize_62(&sStack_90,(&uStack_128)[(int)uVar16],psVar42);
      piVar18[4] = sStack_90.v[4];
      piVar18[2] = sStack_90.v[2];
      piVar18[3] = sStack_90.v[3];
      *piVar18 = sStack_90.v[0];
      piVar18[1] = sStack_90.v[1];
      return;
    }
LAB_00145683:
    lVar20 = (long)(int)uVar16;
    uVar14 = (&uStack_128)[lVar20];
    b = (&psStack_e8)[lVar20];
    a_01 = (int64_t *)((long)uVar14 >> 0x3f ^ uVar14 | lVar20 + -2 >> 0x3f);
    piVar24 = (int64_t *)((long)b >> 0x3f ^ (ulong)b | (ulong)a_01);
    if (piVar24 == (int64_t *)0x0) {
      piVar23 = (int64_t *)(ulong)(uVar16 - 1);
      (&uStack_130)[lVar20] = (&uStack_130)[lVar20] | uVar14 << 0x3e;
      b = (secp256k1_modinv64_modinfo *)((long)b << 0x3e);
      (&piStack_f0)[lVar20] = (int64_t *)((ulong)(&piStack_f0)[lVar20] | (ulong)b);
    }
    if ((int)uStack_128 == 0xb) goto LAB_001458ab;
    uVar16 = (uint)piVar23;
    b = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    piStack_138 = (int64_t *)0x1456e6;
    piVar24 = piVar23;
    a_01 = piVar18;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar18,uVar16,&psVar42->modulus,-1);
    if (iVar4 < 1) goto LAB_001458b0;
    b = (secp256k1_modinv64_modinfo *)0x1;
    piStack_138 = (int64_t *)0x145700;
    piVar24 = piVar23;
    a_01 = piVar18;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar18,uVar16,&psVar42->modulus,1);
    if (0 < iVar4) goto LAB_001458b5;
    b = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    piStack_138 = (int64_t *)0x14571c;
    piVar24 = piVar23;
    a_01 = piVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar28,uVar16,&psVar42->modulus,-1);
    if (iVar4 < 1) goto LAB_001458ba;
    b = (secp256k1_modinv64_modinfo *)0x1;
    piStack_138 = (int64_t *)0x145736;
    piVar24 = piVar23;
    a_01 = piVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar28,uVar16,&psVar42->modulus,1);
    if (-1 < iVar4) goto LAB_001458bf;
    uStack_128 = (ulong)((int)uStack_128 + 1);
    unaff_R12 = psVar42;
    uStack_130._4_4_ = uVar16;
    goto LAB_001453da;
  }
LAB_00145897:
  piStack_138 = (int64_t *)0x14589c;
  secp256k1_modinv64_var_cold_20();
LAB_0014589c:
  piStack_138 = (int64_t *)0x1458a1;
  secp256k1_modinv64_var_cold_19();
LAB_001458a1:
  piStack_138 = (int64_t *)0x1458a6;
  secp256k1_modinv64_var_cold_18();
LAB_001458a6:
  piStack_138 = (int64_t *)0x1458ab;
  secp256k1_modinv64_var_cold_17();
LAB_001458ab:
  piStack_138 = (int64_t *)0x1458b0;
  secp256k1_modinv64_var_cold_14();
LAB_001458b0:
  piStack_138 = (int64_t *)0x1458b5;
  secp256k1_modinv64_var_cold_13();
LAB_001458b5:
  piStack_138 = (int64_t *)0x1458ba;
  secp256k1_modinv64_var_cold_12();
LAB_001458ba:
  piStack_138 = (int64_t *)0x1458bf;
  secp256k1_modinv64_var_cold_11();
LAB_001458bf:
  piStack_138 = (int64_t *)0x1458c4;
  secp256k1_modinv64_var_cold_10();
LAB_001458c4:
  piStack_138 = (int64_t *)0x1458c9;
  secp256k1_modinv64_var_cold_15();
LAB_001458c9:
  piStack_138 = (int64_t *)0x1458ce;
  secp256k1_modinv64_var_cold_16();
  unaff_R12 = psVar42;
LAB_001458ce:
  piStack_138 = (int64_t *)secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  piStack_138 = piVar23;
  if ((ulong)*piVar24 >> 0x3e == 0) {
    uVar14 = piVar24[1];
    if (0x3fffffffffffffff < uVar14) goto LAB_001459cc;
    uVar25 = piVar24[2];
    if (0x3fffffffffffffff < uVar25) goto LAB_001459d1;
    uVar9 = piVar24[3];
    if (0x3fffffffffffffff < uVar9) goto LAB_001459d6;
    b = (secp256k1_modinv64_modinfo *)piVar24[4];
    if ((secp256k1_modinv64_modinfo *)0xff < b) goto LAB_001459db;
    uVar6 = uVar14 << 0x3e | *piVar24;
    uVar17 = uVar25 << 0x3c | uVar14 >> 2;
    uVar25 = uVar9 << 0x3a | uVar25 >> 4;
    uVar14 = (long)b << 0x38 | uVar9 >> 6;
    *a_01 = uVar6;
    a_01[1] = uVar17;
    a_01[2] = uVar25;
    a_01[3] = uVar14;
    uVar16 = (uint)((0xfffffffffffffffd < uVar25 && uVar14 == 0xffffffffffffffff) &&
                   0xbaaedce6af48a03a < uVar17);
    uVar12 = 0;
    if (0xbaaedce6af48a03b < uVar17) {
      uVar12 = uVar16;
    }
    uVar12 = uVar12 | (uVar25 == 0xffffffffffffffff && uVar14 == 0xffffffffffffffff);
    piVar24 = (int64_t *)(ulong)uVar12;
    a_01 = (int64_t *)0xbfd25e8cd0364140;
    uVar13 = 0;
    if (0xbfd25e8cd0364140 < uVar6) {
      uVar13 = uVar16;
    }
    uVar13 = uVar13 | uVar12;
    b = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
    piVar23 = (int64_t *)CONCAT71((int7)((ulong)piVar23 >> 8),0xbaaedce6af48a03a < uVar17);
    if (uVar13 == 0) {
      return;
    }
  }
  else {
    piStack_140 = (int64_t *)0x1459cc;
    secp256k1_scalar_from_signed62_cold_6();
LAB_001459cc:
    piStack_140 = (int64_t *)0x1459d1;
    secp256k1_scalar_from_signed62_cold_5();
LAB_001459d1:
    piStack_140 = (int64_t *)0x1459d6;
    secp256k1_scalar_from_signed62_cold_4();
LAB_001459d6:
    piStack_140 = (int64_t *)0x1459db;
    secp256k1_scalar_from_signed62_cold_3();
LAB_001459db:
    piStack_140 = (int64_t *)0x1459e0;
    secp256k1_scalar_from_signed62_cold_2();
  }
  piStack_140 = (int64_t *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  piStack_140 = unaff_RBP;
  lStack_148 = lVar41;
  piStack_150 = piVar18;
  piStack_158 = piVar28;
  psStack_160 = unaff_R12;
  piStack_168 = piVar23;
  lVar41 = *a_01;
  lStack_188 = a_01[1];
  lStack_190 = a_01[2];
  lStack_198 = a_01[3];
  lStack_1a8 = a_01[4];
  lVar20 = *piVar24;
  piStack_170 = (int64_t *)piVar24[1];
  lVar19 = piVar24[2];
  uStack_1d0 = *extraout_RDX;
  piStack_1c8 = (int64_t *)extraout_RDX[1];
  uStack_1e0 = extraout_RDX[2];
  piStack_1d8 = (int64_t *)extraout_RDX[3];
  lStack_178 = piVar24[3];
  lStack_1b0 = piVar24[4];
  uVar14 = 5;
  psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145a7b;
  piVar18 = a_01;
  iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,&b->modulus,-2);
  piVar23 = piVar24;
  if (iVar4 < 1) {
LAB_00146520:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146525;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00146525:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x14652a;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014652a:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x14652f;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014652f:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146534;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00146534:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146539;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar42 = b;
LAB_00146539:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x14653e;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014653e:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146543;
    secp256k1_modinv64_update_de_62_cold_1();
    b = psVar42;
LAB_00146543:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146548;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_00146548:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x14654d;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014654d:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146552;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_00146552:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146557;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00146557:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x14655c;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014655c:
    piVar24 = piVar18;
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146561;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00146561:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146566;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00146566:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x14656b;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014656b:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146570;
    secp256k1_modinv64_update_de_62_cold_9();
    piVar18 = piVar24;
LAB_00146570:
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146575;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar15 = (secp256k1_modinv64_signed62 *)0x1;
    uVar14 = 5;
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145a9d;
    piVar18 = a_01;
    piStack_1a0 = a_01;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,&b->modulus,1);
    if (-1 < iVar4) goto LAB_00146525;
    uVar14 = 5;
    psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145abc;
    piVar18 = piVar24;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piVar24,5,&b->modulus,-2);
    if (iVar4 < 1) goto LAB_0014652a;
    psVar15 = (secp256k1_modinv64_signed62 *)0x1;
    uVar14 = 5;
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145ad9;
    piVar18 = piVar24;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piVar24,5,&b->modulus,1);
    if (-1 < iVar4) goto LAB_0014652f;
    piVar23 = (int64_t *)0x3fffffffffffffff;
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145aff;
    piStack_1b8 = piVar24;
    lStack_180 = lVar19;
    iVar7 = secp256k1_modinv64_abs(uStack_1d0);
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145b0c;
    piVar18 = piStack_1c8;
    iVar8 = secp256k1_modinv64_abs((int64_t)piStack_1c8);
    psVar15 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar8);
    if ((long)psVar15 < iVar7) goto LAB_00146534;
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145b27;
    iVar7 = secp256k1_modinv64_abs(uStack_1e0);
    psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145b34;
    piVar18 = piStack_1d8;
    iVar8 = secp256k1_modinv64_abs((int64_t)piStack_1d8);
    psVar15 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar8);
    psVar42 = b;
    if ((long)psVar15 < iVar7) goto LAB_00146539;
    uVar14 = uStack_1d0 * lVar41;
    psVar15 = SUB168(SEXT816((long)uStack_1d0) * SEXT816(lVar41),8);
    uVar25 = (long)piStack_1c8 * lVar20;
    piVar18 = SUB168(SEXT816((long)piStack_1c8) * SEXT816(lVar20),8);
    a_01 = (int64_t *)0x7fffffffffffffff;
    lVar19 = (0x7fffffffffffffff - (long)piVar18) - (long)psVar15;
    if ((SBORROW8(0x7fffffffffffffff - (long)piVar18,(long)psVar15) !=
        SBORROW8(lVar19,(ulong)(~uVar25 < uVar14))) !=
        (long)(lVar19 - (ulong)(~uVar25 < uVar14)) < 0 && -1 < (long)piVar18) goto LAB_00146570;
    piVar28 = (int64_t *)(uVar25 + uVar14);
    piVar18 = (int64_t *)((long)piVar18 + (long)psVar15 + (ulong)CARRY8(uVar25,uVar14));
    uVar9 = uStack_1e0 * lVar41;
    lVar19 = SUB168(SEXT816((long)uStack_1e0) * SEXT816(lVar41),8);
    uVar6 = (long)piStack_1d8 * lVar20;
    lVar20 = SUB168(SEXT816((long)piStack_1d8) * SEXT816(lVar20),8);
    uVar25 = (ulong)(-uVar6 - 1 < uVar9);
    lVar41 = (0x7fffffffffffffff - lVar20) - lVar19;
    bVar43 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar19) != SBORROW8(lVar41,uVar25)) !=
             (long)(lVar41 - uVar25) < 0;
    psVar15 = (secp256k1_modinv64_signed62 *)CONCAT71((int7)(-uVar6 - 1 >> 8),bVar43 && -1 < lVar20)
    ;
    if (!bVar43 || -1 >= lVar20) {
      psVar42 = (secp256k1_modinv64_modinfo *)(lStack_1a8 >> 0x3f);
      psVar15 = (secp256k1_modinv64_signed62 *)(lStack_1b0 >> 0x3f);
      lVar26 = ((ulong)piStack_1c8 & (ulong)psVar15) + (uStack_1d0 & (ulong)psVar42);
      piVar34 = (int64_t *)(uVar6 + uVar9);
      lVar20 = lVar20 + lVar19 + (ulong)CARRY8(uVar6,uVar9);
      lVar41 = (b->modulus).v[0];
      uVar10 = b->modulus_inv62;
      uVar14 = lVar26 - (uVar10 * (long)piVar28 + lVar26 & 0x3fffffffffffffff);
      piVar31 = (int64_t *)(uVar14 * lVar41);
      piVar24 = SUB168(SEXT816((long)uVar14) * SEXT816(lVar41),8);
      psStack_1c0 = b;
      if (-1 < (long)piVar24) {
        uVar25 = (ulong)((undefined1 *)(-(long)piVar31 - 1U) < piVar28);
        lVar19 = (0x7fffffffffffffff - (long)piVar24) - (long)piVar18;
        if ((SBORROW8(0x7fffffffffffffff - (long)piVar24,(long)piVar18) != SBORROW8(lVar19,uVar25))
            == (long)(lVar19 - uVar25) < 0) goto LAB_00145c62;
LAB_00145e23:
        psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145e28;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00145e28:
        lVar26 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
        lVar19 = lVar20 - lVar26;
        if ((SBORROW8(lVar20,lVar26) !=
            SBORROW8(lVar19,(ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-uVar10))) ==
            (long)(lVar19 - (ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-uVar10)) < 0)
        goto LAB_00145cb2;
LAB_00145e4a:
        psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145e4f;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar25 = extraout_RAX;
        lVar20 = extraout_RDX_00;
LAB_00145e4f:
        psVar30 = (secp256k1_modinv64_signed62 *)
                  ((-0x8000000000000000 - lVar20) - (ulong)(uVar25 != 0));
        piVar18 = (int64_t *)
                  (((long)piVar28 - (long)psVar30) -
                  (ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-uVar25));
        if ((SBORROW8((long)piVar28,(long)psVar30) !=
            SBORROW8((long)piVar28 - (long)psVar30,
                     (ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-uVar25))) ==
            (long)piVar18 < 0) {
LAB_00145d35:
          uVar9 = uVar10 >> 0x3e | lVar41 << 2;
          bVar43 = CARRY8((ulong)piVar34,uVar25);
          piVar34 = (int64_t *)((long)piVar34 + uVar25);
          piVar28 = (int64_t *)((long)piVar28 + (ulong)bVar43 + lVar20);
          psVar30 = (secp256k1_modinv64_signed62 *)(uStack_1e0 * lStack_188 + uVar9);
          piVar18 = (int64_t *)
                    (SUB168(SEXT816((long)uStack_1e0) * SEXT816(lStack_188),8) + (lVar41 >> 0x3e) +
                    (ulong)CARRY8(uStack_1e0 * lStack_188,uVar9));
          uVar25 = (long)piStack_1d8 * (long)piVar24;
          lVar41 = SUB168(SEXT816((long)piStack_1d8) * SEXT816((long)piVar24),8);
          if (lVar41 < 0) goto LAB_00145e79;
          uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar25) < psVar30);
          lVar20 = (0x7fffffffffffffff - lVar41) - (long)piVar18;
          b = (secp256k1_modinv64_modinfo *)(lVar20 - uVar9);
          if ((SBORROW8(0x7fffffffffffffff - lVar41,(long)piVar18) != SBORROW8(lVar20,uVar9)) !=
              (long)b < 0) goto LAB_00145e91;
        }
        else {
LAB_00145e74:
          psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145e79;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar25 = extraout_RAX_00;
          lVar41 = extraout_RDX_01;
LAB_00145e79:
          b = (secp256k1_modinv64_modinfo *)((-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0));
          if ((SBORROW8((long)piVar18,(long)b) !=
              SBORROW8((long)piVar18 - (long)b,
                       (ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uVar25))) !=
              (long)(((long)piVar18 - (long)b) -
                    (ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uVar25)) < 0) {
LAB_00145e91:
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145e96;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00145e9c;
          }
        }
        bVar43 = CARRY8((ulong)psVar30,uVar25);
        psVar30 = (secp256k1_modinv64_signed62 *)((long)psVar30->v + uVar25);
        piVar18 = (int64_t *)((long)piVar18 + (ulong)bVar43 + lVar41);
        psVar35 = (secp256k1_modinv64_signed62 *)(psStack_1c0->modulus).v[1];
        b = psStack_1c0;
        if (psVar35 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_00145e9c;
        piVar31 = (int64_t *)((long)psVar35 * uVar14);
        piVar33 = SUB168(SEXT816((long)psVar35) * SEXT816((long)uVar14),8);
        if ((long)piVar33 < 0) goto LAB_00146436;
        uVar25 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar31 - 1U) < piVar34);
        lVar41 = (0x7fffffffffffffff - (long)piVar33) - (long)piVar28;
        if ((SBORROW8(0x7fffffffffffffff - (long)piVar33,(long)piVar28) != SBORROW8(lVar41,uVar25))
            != (long)(lVar41 - uVar25) < 0) goto LAB_00146458;
LAB_00145dcf:
        bVar43 = CARRY8((ulong)piVar31,(ulong)piVar34);
        piVar31 = (int64_t *)((long)piVar31 + (long)piVar34);
        piVar33 = (int64_t *)((long)piVar33 + (long)piVar28 + (ulong)bVar43);
        uVar25 = (long)psVar35 * (long)psVar15;
        lVar41 = SUB168(SEXT816((long)psVar35) * SEXT816((long)psVar15),8);
        if (lVar41 < 0) goto LAB_0014645d;
        psVar29 = (secp256k1_modinv64_signed62 *)(-1 - uVar25);
        lVar20 = ((long)a_01 - lVar41) - (long)piVar18;
        puVar32 = (undefined1 *)(lVar20 - (ulong)(psVar29 < psVar30));
        if ((SBORROW8((long)a_01 - lVar41,(long)piVar18) !=
            SBORROW8(lVar20,(ulong)(psVar29 < psVar30))) != (long)puVar32 < 0) goto LAB_0014647f;
LAB_00145e00:
        bVar43 = CARRY8((ulong)psVar30,uVar25);
        psVar30 = (secp256k1_modinv64_signed62 *)((long)psVar30->v + uVar25);
        piVar18 = (int64_t *)((long)piVar18 + (ulong)bVar43 + lVar41);
        piVar28 = piVar33;
        piVar34 = piVar31;
LAB_00145e9c:
        piVar33 = piStack_1a0;
        uVar25 = (long)piVar28 << 2 | (ulong)piVar34 >> 0x3e;
        piVar24 = (int64_t *)(uStack_1d0 * lStack_190 + uVar25);
        psVar35 = (secp256k1_modinv64_signed62 *)
                  (SUB168(SEXT816((long)uStack_1d0) * SEXT816(lStack_190),8) +
                   ((long)piVar28 >> 0x3e) + (ulong)CARRY8(uStack_1d0 * lStack_190,uVar25));
        *piStack_1a0 = (ulong)piVar34 & 0x3fffffffffffffff;
        uVar25 = (long)piStack_1c8 * lStack_180;
        lVar41 = SUB168(SEXT816((long)piStack_1c8) * SEXT816(lStack_180),8);
        *piStack_1b8 = (ulong)psVar30 & 0x3fffffffffffffff;
        if (lVar41 < 0) {
          puVar32 = (undefined1 *)((-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0));
          psVar29 = (secp256k1_modinv64_signed62 *)
                    (((long)psVar35 - (long)puVar32) -
                    (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-uVar25));
          if ((SBORROW8((long)psVar35,(long)puVar32) !=
              SBORROW8((long)psVar35 - (long)puVar32,
                       (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-uVar25))) !=
              (long)psVar29 < 0) goto LAB_00145ffa;
LAB_00145f0a:
          uVar9 = (ulong)psVar30 >> 0x3e | (long)piVar18 << 2;
          bVar43 = CARRY8((ulong)piVar24,uVar25);
          piVar24 = (int64_t *)((long)piVar24 + uVar25);
          psVar35 = (secp256k1_modinv64_signed62 *)((long)psVar35->v + (ulong)bVar43 + lVar41);
          puVar32 = (undefined1 *)(uStack_1e0 * lStack_190 + uVar9);
          psVar29 = (secp256k1_modinv64_signed62 *)
                    (SUB168(SEXT816((long)uStack_1e0) * SEXT816(lStack_190),8) +
                     ((long)piVar18 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * lStack_190,uVar9));
          uVar25 = (long)piStack_1d8 * lStack_180;
          lVar41 = SUB168(SEXT816((long)piStack_1d8) * SEXT816(lStack_180),8);
          if (lVar41 < 0) goto LAB_00145fff;
          uVar9 = (ulong)((undefined1 *)(-1 - uVar25) < puVar32);
          lVar20 = ((long)a_01 - lVar41) - (long)psVar29;
          if ((SBORROW8((long)a_01 - lVar41,(long)psVar29) != SBORROW8(lVar20,uVar9)) !=
              (long)(lVar20 - uVar9) < 0) goto LAB_00146021;
        }
        else {
          psVar29 = (secp256k1_modinv64_signed62 *)(-1 - uVar25);
          lVar20 = ((long)a_01 - lVar41) - (long)psVar35;
          puVar32 = (undefined1 *)(lVar20 - (ulong)(psVar29 < piVar24));
          if ((SBORROW8((long)a_01 - lVar41,(long)psVar35) !=
              SBORROW8(lVar20,(ulong)(psVar29 < piVar24))) == (long)puVar32 < 0) goto LAB_00145f0a;
LAB_00145ffa:
          psStack_1e8 = (secp256k1_modinv64_modinfo *)0x145fff;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar25 = extraout_RAX_01;
          lVar41 = extraout_RDX_02;
LAB_00145fff:
          lVar19 = (-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0);
          lVar20 = (long)psVar29 - lVar19;
          if ((SBORROW8((long)psVar29,lVar19) !=
              SBORROW8(lVar20,(ulong)(puVar32 < (undefined1 *)-uVar25))) !=
              (long)(lVar20 - (ulong)(puVar32 < (undefined1 *)-uVar25)) < 0) {
LAB_00146021:
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146026;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_0014602c;
          }
        }
        bVar43 = CARRY8((ulong)puVar32,uVar25);
        puVar32 = puVar32 + uVar25;
        psVar29 = (secp256k1_modinv64_signed62 *)((long)psVar29->v + (ulong)bVar43 + lVar41);
        piVar31 = (int64_t *)(b->modulus).v[2];
        if (piVar31 == (int64_t *)0x0) goto LAB_0014602c;
        piVar18 = (int64_t *)((long)piVar31 * uVar14);
        psVar30 = SUB168(SEXT816((long)piVar31) * SEXT816((long)uVar14),8);
        if ((long)psVar30 < 0) goto LAB_00146484;
        uVar25 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar18 - 1U) < piVar24);
        lVar41 = ((long)a_01 - (long)psVar30) - (long)psVar35;
        piVar28 = piVar24;
        if ((SBORROW8((long)a_01 - (long)psVar30,(long)psVar35) != SBORROW8(lVar41,uVar25)) !=
            (long)(lVar41 - uVar25) < 0) goto LAB_001464a6;
LAB_00145f9f:
        bVar43 = CARRY8((ulong)piVar18,(ulong)piVar28);
        piVar18 = (int64_t *)((long)piVar18 + (long)piVar28);
        psVar30 = (secp256k1_modinv64_signed62 *)
                  ((long)psVar35->v + (ulong)bVar43 + (long)psVar30->v);
        uVar25 = (long)piVar31 * (long)psVar15;
        lVar41 = SUB168(SEXT816((long)piVar31) * SEXT816((long)psVar15),8);
        if (lVar41 < 0) goto LAB_001464ab;
        piVar36 = (int64_t *)(-1 - uVar25);
        lVar20 = ((long)a_01 - lVar41) - (long)psVar29;
        b = (secp256k1_modinv64_modinfo *)(lVar20 - (ulong)(piVar36 < puVar32));
        piVar24 = piVar18;
        psVar35 = psVar30;
        if ((SBORROW8((long)a_01 - lVar41,(long)psVar29) !=
            SBORROW8(lVar20,(ulong)(piVar36 < puVar32))) != (long)b < 0) goto LAB_001464cd;
LAB_00145fd0:
        bVar43 = CARRY8((ulong)puVar32,uVar25);
        puVar32 = puVar32 + uVar25;
        psVar29 = (secp256k1_modinv64_signed62 *)((long)psVar29->v + (ulong)bVar43 + lVar41);
LAB_0014602c:
        uVar25 = (long)psVar35 << 2 | (ulong)piVar24 >> 0x3e;
        piVar28 = (int64_t *)(uStack_1d0 * lStack_198 + uVar25);
        piVar36 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_1d0) * SEXT816(lStack_198),8) +
                   ((long)psVar35 >> 0x3e) + (ulong)CARRY8(uStack_1d0 * lStack_198,uVar25));
        piVar33[1] = (ulong)piVar24 & 0x3fffffffffffffff;
        uVar25 = (long)piStack_1c8 * lStack_178;
        lVar41 = SUB168(SEXT816((long)piStack_1c8) * SEXT816(lStack_178),8);
        piStack_1b8[1] = (ulong)puVar32 & 0x3fffffffffffffff;
        if (lVar41 < 0) {
          uVar9 = (-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0);
          piVar18 = (int64_t *)
                    (((long)piVar36 - uVar9) -
                    (ulong)(piVar28 < (secp256k1_modinv64_signed62 *)-uVar25));
          if ((SBORROW8((long)piVar36,uVar9) !=
              SBORROW8((long)piVar36 - uVar9,
                       (ulong)(piVar28 < (secp256k1_modinv64_signed62 *)-uVar25))) !=
              (long)piVar18 < 0) goto LAB_00146102;
LAB_00146098:
          uVar6 = (ulong)puVar32 >> 0x3e | (long)psVar29 << 2;
          bVar43 = CARRY8((ulong)piVar28,uVar25);
          piVar28 = (int64_t *)((long)piVar28 + uVar25);
          piVar36 = (int64_t *)((long)piVar36 + (ulong)bVar43 + lVar41);
          uVar9 = uStack_1e0 * lStack_198 + uVar6;
          piVar18 = (int64_t *)
                    (SUB168(SEXT816((long)uStack_1e0) * SEXT816(lStack_198),8) +
                     ((long)psVar29 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * lStack_198,uVar6));
          uVar25 = (long)piStack_1d8 * lStack_178;
          lVar41 = SUB168(SEXT816((long)piStack_1d8) * SEXT816(lStack_178),8);
          if (lVar41 < 0) goto LAB_00146107;
          uVar6 = (ulong)(-uVar25 - 1 < uVar9);
          lVar20 = ((long)a_01 - lVar41) - (long)piVar18;
          bVar43 = SBORROW8((long)a_01 - lVar41,(long)piVar18) != SBORROW8(lVar20,uVar6);
          lVar20 = lVar20 - uVar6;
        }
        else {
          piVar18 = (int64_t *)(-1 - uVar25);
          lVar20 = ((long)a_01 - lVar41) - (long)piVar36;
          uVar9 = lVar20 - (ulong)(piVar18 < piVar28);
          if ((SBORROW8((long)a_01 - lVar41,(long)piVar36) !=
              SBORROW8(lVar20,(ulong)(piVar18 < piVar28))) == (long)uVar9 < 0) goto LAB_00146098;
LAB_00146102:
          psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146107;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar25 = extraout_RAX_02;
          lVar41 = extraout_RDX_03;
LAB_00146107:
          lVar19 = (-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0);
          lVar20 = (long)piVar18 - lVar19;
          bVar43 = SBORROW8((long)piVar18,lVar19) != SBORROW8(lVar20,(ulong)(uVar9 < -uVar25));
          lVar20 = lVar20 - (ulong)(uVar9 < -uVar25);
        }
        b = (secp256k1_modinv64_modinfo *)0x8000000000000000;
        if (bVar43 != lVar20 < 0) goto LAB_00146548;
        psVar30 = (secp256k1_modinv64_signed62 *)(uVar9 + uVar25);
        piVar18 = (int64_t *)((long)piVar18 + (ulong)CARRY8(uVar9,uVar25) + lVar41);
        psVar29 = (secp256k1_modinv64_signed62 *)(psStack_1c0->modulus).v[3];
        if (psVar29 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_001461a6;
        piVar31 = (int64_t *)((long)psVar29 * uVar14);
        piVar33 = SUB168(SEXT816((long)psVar29) * SEXT816((long)uVar14),8);
        if ((long)piVar33 < 0) goto LAB_001464d2;
        uVar25 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar31 - 1U) < piVar28);
        lVar41 = ((long)a_01 - (long)piVar33) - (long)piVar36;
        if ((SBORROW8((long)a_01 - (long)piVar33,(long)piVar36) != SBORROW8(lVar41,uVar25)) !=
            (long)(lVar41 - uVar25) < 0) goto LAB_001464f4;
LAB_00146167:
        bVar43 = CARRY8((ulong)piVar31,(ulong)piVar28);
        piVar31 = (int64_t *)((long)piVar31 + (long)piVar28);
        piVar33 = (int64_t *)((long)piVar33 + (long)piVar36 + (ulong)bVar43);
        uVar25 = (long)psVar29 * (long)psVar15;
        lVar41 = SUB168(SEXT816((long)psVar29) * SEXT816((long)psVar15),8);
        if (lVar41 < 0) goto LAB_001464f9;
        uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar25) < psVar30);
        lVar20 = ((long)a_01 - lVar41) - (long)piVar18;
        piVar36 = piVar33;
        piVar28 = piVar31;
        if ((SBORROW8((long)a_01 - lVar41,(long)piVar18) != SBORROW8(lVar20,uVar9)) ==
            (long)(lVar20 - uVar9) < 0) {
          do {
            bVar43 = CARRY8((ulong)psVar30,uVar25);
            psVar30 = (secp256k1_modinv64_signed62 *)((long)psVar30->v + uVar25);
            piVar18 = (int64_t *)((long)piVar18 + (ulong)bVar43 + lVar41);
LAB_001461a6:
            piVar24 = piStack_1a0;
            uVar25 = (long)piVar36 << 2 | (ulong)piVar28 >> 0x3e;
            psVar35 = (secp256k1_modinv64_signed62 *)((ulong)piVar28 & 0x3fffffffffffffff);
            piVar34 = (int64_t *)(uStack_1d0 * lStack_1a8 + uVar25);
            piVar28 = (int64_t *)
                      (SUB168(SEXT816((long)uStack_1d0) * SEXT816(lStack_1a8),8) +
                       ((long)piVar36 >> 0x3e) + (ulong)CARRY8(uStack_1d0 * lStack_1a8,uVar25));
            piStack_1a0[2] = (int64_t)psVar35;
            uVar25 = (long)piStack_1c8 * lStack_1b0;
            lVar41 = SUB168(SEXT816((long)piStack_1c8) * SEXT816(lStack_1b0),8);
            piStack_1b8[2] = (ulong)psVar30 & 0x3fffffffffffffff;
            if (lVar41 < 0) {
              lVar19 = (-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0);
              lVar20 = (long)piVar28 - lVar19;
              psVar29 = (secp256k1_modinv64_signed62 *)
                        (lVar20 - (ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-uVar25));
              if ((SBORROW8((long)piVar28,lVar19) !=
                  SBORROW8(lVar20,(ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-uVar25))) !=
                  (long)psVar29 < 0) goto LAB_00146280;
LAB_00146214:
              uVar9 = (ulong)psVar30 >> 0x3e | (long)piVar18 << 2;
              bVar43 = CARRY8((ulong)piVar34,uVar25);
              piVar34 = (int64_t *)((long)piVar34 + uVar25);
              piVar28 = (int64_t *)((long)piVar28 + (ulong)bVar43 + lVar41);
              psVar35 = (secp256k1_modinv64_signed62 *)(uStack_1e0 * lStack_1a8 + uVar9);
              psVar29 = (secp256k1_modinv64_signed62 *)
                        (SUB168(SEXT816((long)uStack_1e0) * SEXT816(lStack_1a8),8) +
                         ((long)piVar18 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * lStack_1a8,uVar9));
              uVar25 = (long)piStack_1d8 * lStack_1b0;
              lVar41 = SUB168(SEXT816((long)piStack_1d8) * SEXT816(lStack_1b0),8);
              if (lVar41 < 0) goto LAB_00146285;
              piVar18 = (int64_t *)(-1 - uVar25);
              lVar20 = ((long)a_01 - lVar41) - (long)psVar29;
              bVar43 = SBORROW8((long)a_01 - lVar41,(long)psVar29) !=
                       SBORROW8(lVar20,(ulong)(piVar18 < psVar35));
              piVar31 = (int64_t *)(lVar20 - (ulong)(piVar18 < psVar35));
            }
            else {
              psVar29 = (secp256k1_modinv64_signed62 *)(-1 - uVar25);
              lVar20 = ((long)a_01 - lVar41) - (long)piVar28;
              if ((SBORROW8((long)a_01 - lVar41,(long)piVar28) !=
                  SBORROW8(lVar20,(ulong)(psVar29 < piVar34))) ==
                  (long)(lVar20 - (ulong)(psVar29 < piVar34)) < 0) goto LAB_00146214;
LAB_00146280:
              psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146285;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar25 = extraout_RAX_03;
              lVar41 = extraout_RDX_04;
LAB_00146285:
              lVar19 = (-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0);
              lVar20 = (long)psVar29 - lVar19;
              bVar43 = SBORROW8((long)psVar29,lVar19) !=
                       SBORROW8(lVar20,(ulong)(psVar35 < (secp256k1_modinv64_signed62 *)-uVar25));
              piVar18 = (int64_t *)
                        (lVar20 - (ulong)(psVar35 < (secp256k1_modinv64_signed62 *)-uVar25));
              piVar31 = piVar18;
            }
            b = psStack_1c0;
            piVar33 = (int64_t *)0x8000000000000000;
            if (bVar43 != (long)piVar31 < 0) goto LAB_0014654d;
            piVar31 = (int64_t *)((long)psVar35->v + uVar25);
            psVar35 = (secp256k1_modinv64_signed62 *)
                      ((long)psVar29->v + (ulong)CARRY8((ulong)psVar35,uVar25) + lVar41);
            psVar30 = (secp256k1_modinv64_signed62 *)(psStack_1c0->modulus).v[4];
            piVar18 = (int64_t *)((long)psVar30 * uVar14);
            uVar14 = SUB168(SEXT816((long)psVar30) * SEXT816((long)uVar14),8);
            if ((long)uVar14 < 0) {
              lVar20 = (-0x8000000000000000 - uVar14) - (ulong)(piVar18 != (int64_t *)0x0);
              lVar41 = (long)piVar28 - lVar20;
              if ((SBORROW8((long)piVar28,lVar20) !=
                  SBORROW8(lVar41,(ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-(long)piVar18)))
                  != (long)(lVar41 - (ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-(long)piVar18
                                            )) < 0) goto LAB_00146411;
LAB_001462e0:
              bVar43 = CARRY8((ulong)piVar18,(ulong)piVar34);
              piVar18 = (int64_t *)((long)piVar18 + (long)piVar34);
              uVar14 = (long)piVar28 + bVar43 + uVar14;
              uVar25 = (long)psVar30 * (long)psVar15;
              lVar41 = SUB168(SEXT816((long)psVar30) * SEXT816((long)psVar15),8);
              if (lVar41 < 0) goto LAB_00146416;
              psVar15 = (secp256k1_modinv64_signed62 *)(-uVar25 - 1);
              lVar20 = (long)a_01 - lVar41;
              lVar19 = lVar20 - (long)psVar35;
              a_01 = (int64_t *)(lVar19 - (ulong)(psVar15 < piVar31));
              if ((SBORROW8(lVar20,(long)psVar35) != SBORROW8(lVar19,(ulong)(psVar15 < piVar31))) ==
                  (long)a_01 < 0) goto LAB_0014630e;
            }
            else {
              uVar25 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar18 - 1U) < piVar34);
              lVar41 = ((long)a_01 - uVar14) - (long)piVar28;
              if ((SBORROW8((long)a_01 - uVar14,(long)piVar28) != SBORROW8(lVar41,uVar25)) ==
                  (long)(lVar41 - uVar25) < 0) goto LAB_001462e0;
LAB_00146411:
              psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146416;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar25 = extraout_RAX_04;
              lVar41 = extraout_RDX_05;
LAB_00146416:
              piVar28 = (int64_t *)((-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0));
              psVar15 = (secp256k1_modinv64_signed62 *)
                        (((long)psVar35 - (long)piVar28) -
                        (ulong)(piVar31 < (secp256k1_modinv64_signed62 *)-uVar25));
              if ((SBORROW8((long)psVar35,(long)piVar28) !=
                  SBORROW8((long)psVar35 - (long)piVar28,
                           (ulong)(piVar31 < (secp256k1_modinv64_signed62 *)-uVar25))) ==
                  (long)psVar15 < 0) {
LAB_0014630e:
                a_01 = piStack_1b8;
                lVar41 = (long)psVar35->v + (ulong)CARRY8(uVar25,(ulong)piVar31) + lVar41;
                psVar15 = (secp256k1_modinv64_signed62 *)(uVar14 << 2 | (ulong)piVar18 >> 0x3e);
                piVar24[3] = (ulong)piVar18 & 0x3fffffffffffffff;
                piVar23 = (int64_t *)(uVar25 + (long)piVar31 & 0x3fffffffffffffff);
                piStack_1b8[3] = (int64_t)piVar23;
                piVar18 = psVar15[0x333333333333332].v + 4;
                uVar14 = ((long)uVar14 >> 0x3e) + -1 +
                         (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar15);
                if (uVar14 != 0xffffffffffffffff) goto LAB_00146552;
                uVar14 = 0xffffffffffffffff;
                uVar25 = uVar25 + (long)piVar31 >> 0x3e | lVar41 * 4;
                piVar24[4] = (int64_t)psVar15;
                if ((lVar41 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar25) != -1)
                goto LAB_00146557;
                piStack_1b8[4] = uVar25;
                uVar14 = 5;
                psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146386;
                piVar18 = piVar24;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)piVar24,5,&b->modulus,-2);
                if (iVar4 < 1) goto LAB_0014655c;
                psVar15 = (secp256k1_modinv64_signed62 *)0x1;
                uVar14 = 5;
                psStack_1e8 = (secp256k1_modinv64_modinfo *)0x1463a3;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)piVar24,5,&b->modulus,1);
                if (-1 < iVar4) goto LAB_00146561;
                uVar14 = 5;
                psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_1e8 = (secp256k1_modinv64_modinfo *)0x1463c2;
                piVar24 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,&b->modulus,-2);
                if (iVar4 < 1) goto LAB_00146566;
                psVar15 = (secp256k1_modinv64_signed62 *)0x1;
                uVar14 = 5;
                psStack_1e8 = (secp256k1_modinv64_modinfo *)0x1463df;
                piVar24 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,&b->modulus,1);
                if (iVar4 < 0) {
                  return;
                }
                goto LAB_0014656b;
              }
            }
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146436;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_00146436:
            lVar20 = (-0x8000000000000000 - (long)piVar33) - (ulong)(piVar31 != (int64_t *)0x0);
            lVar41 = (long)piVar28 - lVar20;
            if ((SBORROW8((long)piVar28,lVar20) !=
                SBORROW8(lVar41,(ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-(long)piVar31)))
                == (long)(lVar41 - (ulong)(piVar34 < (secp256k1_modinv64_signed62 *)-(long)piVar31))
                   < 0) goto LAB_00145dcf;
LAB_00146458:
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x14645d;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar25 = extraout_RAX_05;
            lVar41 = extraout_RDX_06;
LAB_0014645d:
            puVar32 = (undefined1 *)((-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0));
            psVar29 = (secp256k1_modinv64_signed62 *)
                      (((long)piVar18 - (long)puVar32) -
                      (ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uVar25));
            if ((SBORROW8((long)piVar18,(long)puVar32) !=
                SBORROW8((long)piVar18 - (long)puVar32,
                         (ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uVar25))) ==
                (long)psVar29 < 0) goto LAB_00145e00;
LAB_0014647f:
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146484;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_00146484:
            lVar20 = (-0x8000000000000000 - (long)psVar30) - (ulong)(piVar18 != (int64_t *)0x0);
            lVar41 = (long)psVar35 - lVar20;
            piVar28 = piVar24;
            if ((SBORROW8((long)psVar35,lVar20) !=
                SBORROW8(lVar41,(ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-(long)piVar18)))
                == (long)(lVar41 - (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-(long)piVar18))
                   < 0) goto LAB_00145f9f;
LAB_001464a6:
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x1464ab;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar25 = extraout_RAX_06;
            lVar41 = extraout_RDX_07;
            piVar28 = piVar24;
LAB_001464ab:
            b = (secp256k1_modinv64_modinfo *)
                ((-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0));
            piVar36 = (int64_t *)
                      (((long)psVar29 - (long)b) - (ulong)(puVar32 < (undefined1 *)-uVar25));
            piVar24 = piVar18;
            psVar35 = psVar30;
            if ((SBORROW8((long)psVar29,(long)b) !=
                SBORROW8((long)psVar29 - (long)b,(ulong)(puVar32 < (undefined1 *)-uVar25))) ==
                (long)piVar36 < 0) goto LAB_00145fd0;
LAB_001464cd:
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x1464d2;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_001464d2:
            lVar20 = (-0x8000000000000000 - (long)piVar33) - (ulong)(piVar31 != (int64_t *)0x0);
            lVar41 = (long)piVar36 - lVar20;
            if ((SBORROW8((long)piVar36,lVar20) !=
                SBORROW8(lVar41,(ulong)(piVar28 < (secp256k1_modinv64_signed62 *)-(long)piVar31)))
                == (long)(lVar41 - (ulong)(piVar28 < (secp256k1_modinv64_signed62 *)-(long)piVar31))
                   < 0) goto LAB_00146167;
LAB_001464f4:
            psStack_1e8 = (secp256k1_modinv64_modinfo *)0x1464f9;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar25 = extraout_RAX_07;
            lVar41 = extraout_RDX_08;
LAB_001464f9:
            lVar19 = (-0x8000000000000000 - lVar41) - (ulong)(uVar25 != 0);
            lVar20 = (long)piVar18 - lVar19;
            piVar36 = piVar33;
            piVar28 = piVar31;
            if ((SBORROW8((long)piVar18,lVar19) !=
                SBORROW8(lVar20,(ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uVar25))) !=
                (long)(lVar20 - (ulong)(psVar30 < (secp256k1_modinv64_signed62 *)-uVar25)) < 0)
            break;
          } while( true );
        }
        psStack_1e8 = (secp256k1_modinv64_modinfo *)0x146520;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_00146520;
      }
      lVar26 = (-0x8000000000000000 - (long)piVar24) - (ulong)(piVar31 != (int64_t *)0x0);
      lVar19 = (long)piVar18 - lVar26;
      if ((SBORROW8((long)piVar18,lVar26) !=
          SBORROW8(lVar19,(ulong)(piVar28 < (undefined1 *)-(long)piVar31))) !=
          (long)(lVar19 - (ulong)(piVar28 < (undefined1 *)-(long)piVar31)) < 0) goto LAB_00145e23;
LAB_00145c62:
      psVar42 = (secp256k1_modinv64_modinfo *)((ulong)psVar42 & uStack_1e0);
      psVar15 = (secp256k1_modinv64_signed62 *)
                ((long)psVar42 +
                (((ulong)psVar15 & (ulong)piStack_1d8) -
                ((long)(psVar42->modulus).v +
                 uVar10 * (long)piVar34 + ((ulong)psVar15 & (ulong)piStack_1d8) & 0x3fffffffffffffff
                )));
      bVar43 = CARRY8((ulong)piVar31,(ulong)piVar28);
      piVar31 = (int64_t *)((long)piVar31 + (long)piVar28);
      piVar24 = (int64_t *)((long)piVar24 + (long)piVar18 + (ulong)bVar43);
      uVar10 = (long)psVar15 * lVar41;
      lVar41 = SUB168(SEXT816((long)psVar15) * SEXT816(lVar41),8);
      if (lVar41 < 0) goto LAB_00145e28;
      uVar25 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar10 - 1) < piVar34);
      lVar19 = (0x7fffffffffffffff - lVar41) - lVar20;
      if ((SBORROW8(0x7fffffffffffffff - lVar41,lVar20) != SBORROW8(lVar19,uVar25)) !=
          (long)(lVar19 - uVar25) < 0) goto LAB_00145e4a;
LAB_00145cb2:
      bVar43 = CARRY8(uVar10,(ulong)piVar34);
      uVar10 = uVar10 + (long)piVar34;
      lVar41 = lVar41 + lVar20 + (ulong)bVar43;
      if (((ulong)piVar31 & 0x3fffffffffffffff) != 0) goto LAB_0014653e;
      b = psVar42;
      if ((uVar10 & 0x3fffffffffffffff) == 0) {
        uVar25 = (ulong)piVar31 >> 0x3e | (long)piVar24 << 2;
        piVar34 = (int64_t *)(uStack_1d0 * lStack_188 + uVar25);
        piVar28 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_1d0) * SEXT816(lStack_188),8) +
                   ((long)piVar24 >> 0x3e) + (ulong)CARRY8(uStack_1d0 * lStack_188,uVar25));
        uVar25 = (long)piStack_1c8 * (long)piStack_170;
        lVar20 = SUB168(SEXT816((long)piStack_1c8) * SEXT816((long)piStack_170),8);
        piVar24 = piStack_170;
        if (lVar20 < 0) goto LAB_00145e4f;
        piVar18 = (int64_t *)(-1 - uVar25);
        lVar19 = (0x7fffffffffffffff - lVar20) - (long)piVar28;
        psVar30 = (secp256k1_modinv64_signed62 *)(lVar19 - (ulong)(piVar18 < piVar34));
        if ((SBORROW8(0x7fffffffffffffff - lVar20,(long)piVar28) !=
            SBORROW8(lVar19,(ulong)(piVar18 < piVar34))) != (long)psVar30 < 0) goto LAB_00145e74;
        goto LAB_00145d35;
      }
      goto LAB_00146543;
    }
  }
  iVar4 = (int)uVar14;
  psStack_1e8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar35 = &sStack_248;
  piStack_1f8 = piVar23;
  piStack_1f0 = a_01;
  psStack_1e8 = b;
  secp256k1_modinv64_mul_62(&sStack_220,(secp256k1_modinv64_signed62 *)piVar18,iVar4,1);
  psVar30 = a_00;
  secp256k1_modinv64_mul_62(&sStack_248,a_00,5,(int64_t)psVar15);
  lVar41 = 0;
  while ((ulong)sStack_220.v[lVar41] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_248.v[lVar41]) goto LAB_0014660a;
    lVar41 = lVar41 + 1;
    if (lVar41 == 4) {
      uVar16 = 4;
      while( true ) {
        if (sStack_220.v[uVar16] < sStack_248.v[uVar16]) {
          return;
        }
        if (sStack_248.v[uVar16] < sStack_220.v[uVar16]) break;
        bVar43 = uVar16 == 0;
        uVar16 = uVar16 - 1;
        if (bVar43) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014660a:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)psVar35;
  if (iVar4 < 1) {
LAB_001468b7:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_001468bc:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_001468c1:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_001468c6:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_001468cb:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_001468d0:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar41 = psVar15->v[0];
    lVar20 = psVar15->v[1];
    lVar19 = psVar30->v[0];
    lVar26 = *extraout_RDX_09;
    uVar14 = lVar19 * lVar41;
    lVar21 = SUB168(SEXT816(lVar19) * SEXT816(lVar41),8);
    uVar25 = lVar26 * lVar20;
    lVar22 = SUB168(SEXT816(lVar26) * SEXT816(lVar20),8);
    lVar2 = (0x7fffffffffffffff - lVar22) - lVar21;
    if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar21) != SBORROW8(lVar2,(ulong)(~uVar25 < uVar14)))
        != (long)(lVar2 - (ulong)(~uVar25 < uVar14)) < 0 && -1 < lVar22) goto LAB_001468d0;
    lVar2 = psVar15->v[2];
    lVar1 = psVar15->v[3];
    lVar22 = lVar22 + lVar21 + (ulong)CARRY8(uVar25,uVar14);
    uVar6 = lVar19 * lVar2;
    lVar21 = SUB168(SEXT816(lVar19) * SEXT816(lVar2),8);
    uVar17 = lVar26 * lVar1;
    lVar26 = SUB168(SEXT816(lVar26) * SEXT816(lVar1),8);
    uVar9 = (ulong)(-uVar17 - 1 < uVar6);
    lVar19 = (0x7fffffffffffffff - lVar26) - lVar21;
    if ((SBORROW8(0x7fffffffffffffff - lVar26,lVar21) != SBORROW8(lVar19,uVar9)) ==
        (long)(lVar19 - uVar9) < 0 || lVar26 < 0) {
      lVar19 = lVar26 + lVar21 + (ulong)CARRY8(uVar17,uVar6);
      if ((uVar25 + uVar14 & 0x3fffffffffffffff) != 0) goto LAB_001468bc;
      if ((uVar17 + uVar6 & 0x3fffffffffffffff) != 0) goto LAB_001468c1;
      uVar9 = uVar17 + uVar6 >> 0x3e | lVar19 * 4;
      uVar14 = uVar25 + uVar14 >> 0x3e | lVar22 * 4;
      lVar19 = lVar19 >> 0x3e;
      lVar22 = lVar22 >> 0x3e;
      if (iVar4 != 1) {
        psVar35 = (secp256k1_modinv64_signed62 *)((ulong)psVar35 & 0xffffffff);
        psVar15 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar26 = psVar30->v[(long)psVar15];
          uVar6 = lVar26 * lVar41 + uVar14;
          lVar37 = SUB168(SEXT816(lVar26) * SEXT816(lVar41),8) + lVar22 +
                   (ulong)CARRY8(lVar26 * lVar41,uVar14);
          lVar21 = extraout_RDX_09[(long)psVar15];
          uVar25 = lVar21 * lVar20;
          lVar22 = SUB168(SEXT816(lVar21) * SEXT816(lVar20),8);
          if (lVar22 < 0) {
            lVar39 = (-0x8000000000000000 - lVar22) - (ulong)(uVar25 != 0);
            lVar3 = lVar37 - lVar39;
            if ((SBORROW8(lVar37,lVar39) != SBORROW8(lVar3,(ulong)(uVar6 < -uVar25))) ==
                (long)(lVar3 - (ulong)(uVar6 < -uVar25)) < 0) goto LAB_001467a6;
LAB_001468ad:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_001468b2:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_001468b7;
          }
          uVar14 = (ulong)(-uVar25 - 1 < uVar6);
          lVar3 = (0x7fffffffffffffff - lVar22) - lVar37;
          if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar37) != SBORROW8(lVar3,uVar14)) !=
              (long)(lVar3 - uVar14) < 0) goto LAB_001468ad;
LAB_001467a6:
          lVar22 = lVar37 + lVar22 + (ulong)CARRY8(uVar6,uVar25);
          uVar40 = lVar26 * lVar2 + uVar9;
          lVar26 = SUB168(SEXT816(lVar26) * SEXT816(lVar2),8) + lVar19 +
                   (ulong)CARRY8(lVar26 * lVar2,uVar9);
          uVar17 = lVar21 * lVar1;
          lVar19 = SUB168(SEXT816(lVar21) * SEXT816(lVar1),8);
          if (lVar19 < 0) {
            lVar37 = (-0x8000000000000000 - lVar19) - (ulong)(uVar17 != 0);
            lVar21 = lVar26 - lVar37;
            if ((SBORROW8(lVar26,lVar37) != SBORROW8(lVar21,(ulong)(uVar40 < -uVar17))) !=
                (long)(lVar21 - (ulong)(uVar40 < -uVar17)) < 0) goto LAB_001468b2;
          }
          else {
            uVar14 = (ulong)(-uVar17 - 1 < uVar40);
            lVar21 = (0x7fffffffffffffff - lVar19) - lVar26;
            if ((SBORROW8(0x7fffffffffffffff - lVar19,lVar26) != SBORROW8(lVar21,uVar14)) !=
                (long)(lVar21 - uVar14) < 0) goto LAB_001468b2;
          }
          lVar19 = lVar26 + lVar19 + (ulong)CARRY8(uVar40,uVar17);
          uVar14 = lVar22 * 4 | uVar6 + uVar25 >> 0x3e;
          psVar30->v[(long)((long)psVar15[-1].v + 0x27)] = uVar6 + uVar25 & 0x3fffffffffffffff;
          uVar9 = lVar19 * 4 | uVar40 + uVar17 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar15[-1].v + 0x27)] = uVar40 + uVar17 & 0x3fffffffffffffff
          ;
          psVar15 = (secp256k1_modinv64_signed62 *)((long)psVar15->v + 1);
          lVar19 = lVar19 >> 0x3e;
          lVar22 = lVar22 >> 0x3e;
        } while (psVar35 != psVar15);
      }
      if (lVar22 + -1 + (ulong)(0x7fffffffffffffff < uVar14) != -1) goto LAB_001468c6;
      psVar30->v[(long)iVar4 + -1] = uVar14;
      if (lVar19 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
        extraout_RDX_09[(long)iVar4 + -1] = uVar9;
        return;
      }
      goto LAB_001468cb;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar41 = psVar35->v[0];
  lVar20 = psVar35->v[1];
  lVar19 = psVar35->v[2];
  lVar26 = psVar35->v[3];
  lVar2 = psVar35->v[4];
  lVar21 = 0;
  do {
    if (psVar35->v[lVar21] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00146b06:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00146b0b;
    }
    if (0x3fffffffffffffff < psVar35->v[lVar21]) goto LAB_00146b06;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(psVar35,5,b_00,-2);
  if (iVar4 < 1) {
LAB_00146b0b:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00146b10:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00146b15:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar35,5,b_00,1);
    if (-1 < iVar4) goto LAB_00146b10;
    uVar14 = lVar2 >> 0x3f;
    uVar6 = (long)psVar30 >> 0x3f;
    uVar25 = ((uVar14 & b_00->v[0]) + lVar41 ^ uVar6) - uVar6;
    uVar17 = ((long)uVar25 >> 0x3e) + (((uVar14 & b_00->v[1]) + lVar20 ^ uVar6) - uVar6);
    uVar40 = ((long)uVar17 >> 0x3e) + ((lVar19 + (uVar14 & b_00->v[2]) ^ uVar6) - uVar6);
    uVar9 = ((long)uVar40 >> 0x3e) + (((uVar14 & b_00->v[3]) + lVar26 ^ uVar6) - uVar6);
    lVar41 = ((long)uVar9 >> 0x3e) + (((uVar14 & b_00->v[4]) + lVar2 ^ uVar6) - uVar6);
    uVar6 = lVar41 >> 0x3f;
    uVar14 = (b_00->v[0] & uVar6) + (uVar25 & 0x3fffffffffffffff);
    uVar17 = ((long)uVar14 >> 0x3e) + (b_00->v[1] & uVar6) + (uVar17 & 0x3fffffffffffffff);
    uVar25 = ((long)uVar17 >> 0x3e) + (b_00->v[2] & uVar6) + (uVar40 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar25 >> 0x3e) + (b_00->v[3] & uVar6) + (uVar9 & 0x3fffffffffffffff);
    uVar6 = (b_00->v[4] & uVar6) + lVar41 + ((long)uVar9 >> 0x3e);
    psVar35->v[0] = uVar14 & 0x3fffffffffffffff;
    psVar35->v[1] = uVar17 & 0x3fffffffffffffff;
    psVar35->v[2] = uVar25 & 0x3fffffffffffffff;
    psVar35->v[3] = uVar9 & 0x3fffffffffffffff;
    psVar35->v[4] = uVar6;
    if (0x3fffffffffffffff < uVar6) goto LAB_00146b15;
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar35,5,b_00,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(psVar35,5,b_00,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_00146b1f;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00146b1f:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r, const secp256k1_scalar *a) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const uint64_t a0 = a->d[0], a1 = a->d[1], a2 = a->d[2], a3 = a->d[3];

#ifdef VERIFY
    VERIFY_CHECK(secp256k1_scalar_check_overflow(a) == 0);
#endif

    r->v[0] =  a0                   & M62;
    r->v[1] = (a0 >> 62 | a1 <<  2) & M62;
    r->v[2] = (a1 >> 60 | a2 <<  4) & M62;
    r->v[3] = (a2 >> 58 | a3 <<  6) & M62;
    r->v[4] =  a3 >> 56;
}